

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_lights.cxx
# Opt level: O0

void __thiscall
xray_re::xr_level_lights::load(xr_level_lights *this,uint32_t xrlc_version,xr_reader *r)

{
  xr_reader *local_28;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_lights *pxStack_10;
  uint32_t xrlc_version_local;
  xr_level_lights *this_local;
  
  local_28 = (xr_reader *)0x0;
  s = r;
  r_local._4_4_ = xrlc_version;
  pxStack_10 = this;
  if (xrlc_version == 5) {
    local_28 = xr_reader::open_chunk(r,8);
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_lights.cxx"
                    ,0x47,"void xray_re::xr_level_lights::load(uint32_t, xr_reader &)");
    }
    load_v5(this,local_28);
  }
  else if (xrlc_version == 8) {
    local_28 = xr_reader::open_chunk(r,7);
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_lights.cxx"
                    ,0x4c,"void xray_re::xr_level_lights::load(uint32_t, xr_reader &)");
    }
    load_v8(this,local_28);
  }
  else if (xrlc_version == 9) {
    local_28 = xr_reader::open_chunk(r,8);
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_lights.cxx"
                    ,0x51,"void xray_re::xr_level_lights::load(uint32_t, xr_reader &)");
    }
    load_v13(this,local_28);
  }
  else {
    local_28 = xr_reader::open_chunk(r,6);
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_lights.cxx"
                    ,0x56,"void xray_re::xr_level_lights::load(uint32_t, xr_reader &)");
    }
    load_v13(this,local_28);
  }
  xr_reader::close_chunk(s,&local_28);
  return;
}

Assistant:

void xr_level_lights::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	switch (xrlc_version) {
	case XRLC_VERSION_5:
		s = r.open_chunk(FSL5_LIGHT_DYNAMIC);
		xr_assert(s);
		load_v5(*s);
		break;
	case XRLC_VERSION_8:
		s = r.open_chunk(FSL8_LIGHT_DYNAMIC);
		xr_assert(s);
		load_v8(*s);
		break;
	case XRLC_VERSION_9:
		s = r.open_chunk(FSL9_LIGHT_DYNAMIC);
		xr_assert(s);
		load_v13(*s);
		break;
	default: //10+
		s = r.open_chunk(FSL13_LIGHT_DYNAMIC);
		xr_assert(s);
		load_v13(*s);
		break;
	}
	r.close_chunk(s);
}